

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatEntry.cpp
# Opt level: O0

string * __thiscall
FatEntry::getShortFilename_abi_cxx11_(string *__return_storage_ptr__,FatEntry *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  string local_b0;
  undefined1 local_90 [8];
  string base;
  string local_60;
  undefined1 local_40 [8];
  string ext;
  FatEntry *this_local;
  string *name;
  
  ext.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)this);
  trim((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)this);
  trim((string *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = isErased(this);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_d0,(ulong)local_90);
    std::__cxx11::string::operator=((string *)local_90,local_d0);
    std::__cxx11::string::~string(local_d0);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_90);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"");
  if (bVar1) {
    std::operator+(&local_f0,".",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  ext.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  if ((ext.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FatEntry::getShortFilename()
{
    string name;
    string ext = trim(shortName.substr(8,3));
    string base = trim(shortName.substr(0,8));

    if (isErased()) {
        base = base.substr(1);
    }

    name = base;

    if (ext != "") {
        name += "." + ext;
    }

    return name;
}